

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O0

void __thiscall
embree::CommandLineParser::
registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__11>
          (CommandLineParser *this,string *name,anon_class_8_1_8991fb9c_for_f *f,string *description
          )

{
  long *plVar1;
  mapped_type *pmVar2;
  string *in_RCX;
  Ref<embree::CommandLineParser::CommandLineOption> closure;
  anon_class_8_1_8991fb9c_for_f *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:521:39)>
  *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff78;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff7c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
  *in_stack_ffffffffffffff80;
  string local_78 [32];
  long *local_58;
  string *local_50;
  long *local_30;
  long **local_28;
  long **local_20;
  mapped_type *local_18;
  long **local_10;
  
  local_50 = in_RCX;
  plVar1 = (long *)::operator_new(0x38);
  uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff78);
  std::__cxx11::string::string(local_78,local_50);
  CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:521:39)>
  ::CommandLineOptionClosure
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  uVar3 = uVar3 & 0xffffff;
  local_28 = &local_58;
  local_30 = plVar1;
  local_58 = plVar1;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
  }
  std::__cxx11::string::~string(local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back((vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
               *)in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](in_stack_ffffffffffffff80,
                        (key_type *)CONCAT44(in_stack_ffffffffffffff7c,uVar3));
  local_20 = &local_58;
  local_18 = pmVar2;
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 0x10))();
  }
  if (pmVar2->ptr != (CommandLineOption *)0x0) {
    (*(pmVar2->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar2->ptr = (CommandLineOption *)*local_20;
  local_10 = &local_58;
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 0x18))();
  }
  return;
}

Assistant:

void registerOption(const std::string& name, const F& f, const std::string& description) 
    {
      Ref<CommandLineOption> closure = new CommandLineOptionClosure<F>(description,f);
      commandLineOptionList.push_back(closure);
      commandLineOptionMap[name] = closure;
    }